

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

size_t Q_GetDim(QMatrix *Q)

{
  LASErrIdType LVar1;
  size_t sVar2;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    sVar2 = Q->Dim;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t Q_GetDim(QMatrix *Q)
/* returns the dimension of the matrix Q */
{
    size_t Dim;

    if (LASResult() == LASOK)
        Dim = Q->Dim;
    else
        Dim = 0;
    return(Dim);
}